

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_opt_json.c
# Opt level: O1

gravity_value_t JSON_value(gravity_vm *vm,json_value *json)

{
  uint n;
  char *pcVar1;
  size_t sVar2;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar3;
  gravity_value_t *pgVar4;
  gravity_class_t **ppgVar5;
  char *pcVar6;
  ulong uVar7;
  gravity_value_t gVar8;
  
  switch(json->type) {
  default:
    gVar8.field_1.n = 0;
    gVar8.isa = gravity_class_null;
    break;
  case json_object:
    aVar3.p = gravity_object_deserialize(vm,json);
    ppgVar5 = &(aVar3.p)->isa;
    if ((gravity_object_t *)aVar3.n == (gravity_object_t *)0x0) {
      ppgVar5 = &gravity_class_null;
    }
    gVar8.field_1.n = aVar3.n;
    gVar8.isa = ((gravity_object_t *)ppgVar5)->isa;
    break;
  case json_array:
    n = (json->u).string.length;
    aVar3.p = (gravity_object_t *)gravity_list_new(vm,n);
    if ((ulong)n != 0) {
      uVar7 = 0;
      do {
        gVar8 = JSON_value(vm,*(json_value **)((json->u).string.ptr + uVar7 * 8));
        pcVar1 = (aVar3.p)->identifier;
        if ((char *)((gravity_value_r *)&(aVar3.p)->objclass)->n == pcVar1) {
          pcVar6 = (char *)((long)pcVar1 * 2);
          if (pcVar1 == (char *)0x0) {
            pcVar6 = (char *)0x8;
          }
          (aVar3.p)->identifier = pcVar6;
          pgVar4 = (gravity_value_t *)
                   realloc(*(gravity_value_t **)&(aVar3.p)->has_outer,(long)pcVar6 << 4);
          *(gravity_value_t **)&(aVar3.p)->has_outer = pgVar4;
        }
        sVar2 = ((gravity_value_r *)&(aVar3.p)->objclass)->n;
        pgVar4 = *(gravity_value_t **)&(aVar3.p)->has_outer;
        ((gravity_value_r *)&(aVar3.p)->objclass)->n = sVar2 + 1;
        pgVar4[sVar2].isa = gVar8.isa;
        pgVar4[sVar2].field_1.n = (gravity_int_t)gVar8.field_1;
        uVar7 = uVar7 + 1;
      } while (n != uVar7);
    }
    gVar8.field_1.p = (gravity_object_t *)aVar3.n;
    gVar8.isa = (aVar3.p)->isa;
    break;
  case json_integer:
    ppgVar5 = &gravity_class_int;
    goto LAB_00140e60;
  case json_double:
    ppgVar5 = &gravity_class_float;
LAB_00140e60:
    gVar8.field_1 =
         (anon_union_8_3_4e90ac68_for_gravity_value_t_1)
         (anon_union_8_3_4e90ac68_for_gravity_value_t_1)(json->u).integer;
    gVar8.isa = *ppgVar5;
    break;
  case json_string:
    gVar8 = gravity_string_to_value(vm,(json->u).string.ptr,(json->u).string.length);
    break;
  case json_boolean:
    gVar8.field_1 =
         (anon_union_8_3_4e90ac68_for_gravity_value_t_1)
         (anon_union_8_3_4e90ac68_for_gravity_value_t_1)(long)(json->u).boolean;
    gVar8.isa = gravity_class_bool;
  }
  return gVar8;
}

Assistant:

static gravity_value_t JSON_value (gravity_vm *vm, json_value *json) {
    switch (json->type) {
        case json_none:
        case json_null:
            return VALUE_FROM_NULL;
            
        case json_object: {
            gravity_object_t *obj = gravity_object_deserialize(vm, json);
            gravity_value_t objv = (obj) ? VALUE_FROM_OBJECT(obj) : VALUE_FROM_NULL;
            return objv;
        }
            
        case json_array: {
            unsigned int length = json->u.array.length;
            gravity_list_t *list = gravity_list_new(vm, length);
            for (unsigned int i = 0; i < length; ++i) {
                gravity_value_t value = JSON_value(vm, json->u.array.values[i]);
                marray_push(gravity_value_t, list->array, value);
            }
            return VALUE_FROM_OBJECT(list);
        }
            
        case json_integer:
            return VALUE_FROM_INT(json->u.integer);
            
        case json_double:
            return VALUE_FROM_FLOAT(json->u.dbl);
            
        case json_string:
            return VALUE_FROM_STRING(vm, json->u.string.ptr, json->u.string.length);
            
        case json_boolean:
            return VALUE_FROM_BOOL(json->u.boolean);
    }
    
    return VALUE_FROM_NULL;
}